

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_wall_distance_static(REF_GRID ref_grid,REF_DICT ref_dict,REF_DBL *distance)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_INT depth;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL timing;
  REF_DBL scale;
  REF_DBL radius;
  REF_DBL center [3];
  REF_SEARCH local_88;
  REF_SEARCH ref_search;
  REF_INT *pRStack_78;
  REF_INT i;
  REF_INT *permutation;
  REF_INT cell;
  REF_INT node;
  REF_INT node_per;
  REF_INT local_node_per;
  REF_DBL *xyz;
  REF_DBL *local_xyz;
  REF_INT max_ncell;
  REF_INT part_complete;
  REF_INT *part_ncell;
  REF_INT local_ncell;
  REF_INT ncell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_DBL *distance_local;
  REF_DICT ref_dict_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  _local_ncell = ref_grid->node;
  _ref_private_macro_code_rss = 1.00000001;
  ref_private_status_reis_ai._4_4_ = 0;
  if (ref_grid->twod == 0) {
    cell = 3;
  }
  else {
    cell = 2;
  }
  for (permutation._4_4_ = 0; permutation._4_4_ < _local_ncell->max;
      permutation._4_4_ = permutation._4_4_ + 1) {
    if (((-1 < permutation._4_4_) && (permutation._4_4_ < _local_ncell->max)) &&
       (-1 < _local_ncell->global[permutation._4_4_])) {
      distance[permutation._4_4_] = 1e+200;
    }
  }
  ref_mpi = (REF_MPI)distance;
  distance_local = (REF_DBL *)ref_dict;
  ref_dict_local = (REF_DICT)ref_grid;
  ref_private_status_reis_ai._0_4_ =
       ref_phys_local_wall(ref_grid,ref_dict,&node,(REF_INT *)&part_ncell,&xyz);
  if ((uint)ref_private_status_reis_ai == 0) {
    ref_private_status_reis_bi = (REF_LONG)cell;
    _ref_private_macro_code_rss_2 = (long)node;
    if (ref_private_status_reis_bi == _ref_private_macro_code_rss_2) {
      if (ref_node->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x687,"ref_phys_wall_distance_static","malloc part_ncell of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        _max_ncell = (REF_INT *)malloc((long)ref_node->n << 2);
        if (_max_ncell == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x687,"ref_phys_wall_distance_static","malloc part_ncell of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          ref_private_macro_code_rss_3 =
               ref_mpi_allgather((REF_MPI)ref_node,&part_ncell,_max_ncell,1);
          if (ref_private_macro_code_rss_3 == 0) {
            ref_private_macro_code_rss_3 = 0;
            if ((ref_private_status_reis_ai._4_4_ != 0) && (ref_node->max == 0)) {
              for (ref_search._4_4_ = 0; (int)ref_search._4_4_ < ref_node->n;
                  ref_search._4_4_ = ref_search._4_4_ + 1) {
                printf("%d part %d ncell\n",(ulong)ref_search._4_4_,
                       (ulong)(uint)_max_ncell[(int)ref_search._4_4_]);
              }
            }
            if (ref_private_status_reis_ai._4_4_ != 0) {
              ref_mpi_stopwatch_stop((REF_MPI)ref_node,"wall dist init");
            }
            local_xyz._0_4_ = 1000000;
            local_xyz._4_4_ = 0;
            while (local_xyz._4_4_ < ref_node->n) {
              _node_per = (REF_DBL *)0x0;
              part_ncell._4_4_ = 0;
              ref_private_macro_code_rss_4 =
                   ref_phys_bcast_parts
                             ((REF_MPI)ref_node,(REF_INT *)((long)&local_xyz + 4),_max_ncell,
                              (REF_INT)local_xyz,cell,xyz,(REF_INT *)((long)&part_ncell + 4),
                              (REF_DBL **)&node_per);
              if (ref_private_macro_code_rss_4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x699,"ref_phys_wall_distance_static",
                       (ulong)(uint)ref_private_macro_code_rss_4,"bcast part");
                return ref_private_macro_code_rss_4;
              }
              if (ref_private_status_reis_ai._4_4_ != 0) {
                ref_mpi_stopwatch_stop((REF_MPI)ref_node,"form-scatter");
              }
              ref_private_macro_code_rss_5 = ref_search_create(&local_88,part_ncell._4_4_);
              if (ref_private_macro_code_rss_5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x69d,"ref_phys_wall_distance_static",
                       (ulong)(uint)ref_private_macro_code_rss_5,"make search");
                return ref_private_macro_code_rss_5;
              }
              if ((int)part_ncell._4_4_ < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x69e,"ref_phys_wall_distance_static",
                       "malloc permutation of REF_INT negative");
                return 1;
              }
              pRStack_78 = (REF_INT *)malloc((long)(int)part_ncell._4_4_ << 2);
              if (pRStack_78 == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x69e,"ref_phys_wall_distance_static","malloc permutation of REF_INT NULL");
                return 2;
              }
              ref_private_macro_code_rss_6 = ref_sort_shuffle(part_ncell._4_4_,pRStack_78);
              if (ref_private_macro_code_rss_6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x69f,"ref_phys_wall_distance_static",
                       (ulong)(uint)ref_private_macro_code_rss_6,"shuffle");
                return ref_private_macro_code_rss_6;
              }
              ref_private_macro_code_rss_6 = 0;
              for (ref_search._4_4_ = 0; (int)ref_search._4_4_ < (int)part_ncell._4_4_;
                  ref_search._4_4_ = ref_search._4_4_ + 1) {
                permutation._0_4_ = pRStack_78[(int)ref_search._4_4_];
                depth = ref_node_bounding_sphere_xyz
                                  (_node_per + cell * 3 * (int)permutation,cell,&radius,&scale);
                if (depth != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x6a4,"ref_phys_wall_distance_static",(ulong)(uint)depth,"bound");
                  return depth;
                }
                ref_private_macro_code_rss_7 =
                     ref_search_insert(local_88,(int)permutation,&radius,
                                       _ref_private_macro_code_rss * scale);
                if (ref_private_macro_code_rss_7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x6a5,"ref_phys_wall_distance_static",
                         (ulong)(uint)ref_private_macro_code_rss_7,"ins");
                  return ref_private_macro_code_rss_7;
                }
                ref_private_macro_code_rss_7 = 0;
              }
              if (pRStack_78 != (REF_INT *)0x0) {
                free(pRStack_78);
              }
              if (ref_private_status_reis_ai._4_4_ != 0) {
                ref_mpi_stopwatch_stop((REF_MPI)ref_node,"create-insert");
              }
              if ((ref_private_status_reis_ai._4_4_ != 0) && (ref_node->max == 0)) {
                uVar1 = ref_search_depth(local_88,&ref_private_macro_code_rss_8);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x6ab,"ref_phys_wall_distance_static",(ulong)uVar1,"depth");
                  return uVar1;
                }
                printf("ncell %d depth %d\n",(ulong)part_ncell._4_4_,
                       (ulong)(uint)ref_private_macro_code_rss_8);
              }
              if (ref_private_status_reis_ai._4_4_ != 0) {
                ref_mpi_stopwatch_stop((REF_MPI)ref_node,"depth");
              }
              for (permutation._4_4_ = 0; permutation._4_4_ < _local_ncell->max;
                  permutation._4_4_ = permutation._4_4_ + 1) {
                if ((((-1 < permutation._4_4_) && (permutation._4_4_ < _local_ncell->max)) &&
                    (-1 < _local_ncell->global[permutation._4_4_])) &&
                   (uVar1 = ref_search_nearest_element
                                      (local_88,cell,_node_per,
                                       (REF_DBL *)
                                       (*(long *)(*(long *)&ref_dict_local->naux + 0x38) +
                                       (long)(permutation._4_4_ * 0xf) * 8),
                                       (REF_DBL *)(&ref_mpi->n + (long)permutation._4_4_ * 2)),
                   uVar1 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x6b5,"ref_phys_wall_distance_static",(ulong)uVar1,"candidates");
                  return uVar1;
                }
              }
              uVar1 = ref_search_free(local_88);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x6b7,"ref_phys_wall_distance_static",(ulong)uVar1,"free");
                return uVar1;
              }
              if (_node_per != (REF_DBL *)0x0) {
                free(_node_per);
              }
              if (ref_private_status_reis_ai._4_4_ != 0) {
                ref_mpi_stopwatch_stop((REF_MPI)ref_node,"min(dist)");
              }
            }
            if (_max_ncell != (REF_INT *)0x0) {
              free(_max_ncell);
            }
            if (xyz != (REF_DBL *)0x0) {
              free(xyz);
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x689,"ref_phys_wall_distance_static",(ulong)(uint)ref_private_macro_code_rss_3,
                   "allgather part ncell");
            ref_grid_local._4_4_ = ref_private_macro_code_rss_3;
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x685,
             "ref_phys_wall_distance_static","node_per miss match",ref_private_status_reis_bi,
             _ref_private_macro_code_rss_2);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x684,
           "ref_phys_wall_distance_static",(ulong)(uint)ref_private_status_reis_ai,"local wall");
    ref_grid_local._4_4_ = (uint)ref_private_status_reis_ai;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_wall_distance_static(REF_GRID ref_grid,
                                                 REF_DICT ref_dict,
                                                 REF_DBL *distance) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ncell, local_ncell, *part_ncell, part_complete, max_ncell;
  REF_DBL *local_xyz, *xyz;
  REF_INT local_node_per, node_per;
  REF_INT node, cell;
  REF_INT *permutation, i;
  REF_SEARCH ref_search;
  REF_DBL center[3], radius;
  REF_DBL scale = 1.0 + 1.0e-8;
  REF_BOOL timing = REF_FALSE;

  if (timing) ref_mpi_stopwatch_start(ref_mpi);

  if (ref_grid_twod(ref_grid)) {
    node_per = 2;
  } else {
    node_per = 3;
  }

  each_ref_node_valid_node(ref_node, node) { distance[node] = REF_DBL_MAX; }

  RSS(ref_phys_local_wall(ref_grid, ref_dict, &local_node_per, &local_ncell,
                          &local_xyz),
      "local wall");
  REIS(node_per, local_node_per, "node_per miss match");

  ref_malloc(part_ncell, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &local_ncell, part_ncell, REF_INT_TYPE),
      "allgather part ncell");
  if (timing && ref_mpi_once(ref_mpi)) {
    for (i = 0; i < ref_mpi_n(ref_mpi); i++) {
      printf("%d part %d ncell\n", i, part_ncell[i]);
    }
  }
  if (timing) ref_mpi_stopwatch_stop(ref_mpi, "wall dist init");

  max_ncell = 1000000; /* (8 * 3 * node_per) bytes per element */

  part_complete = 0;
  while (part_complete < ref_mpi_n(ref_mpi)) {
    xyz = NULL;
    ncell = 0;
    RSS(ref_phys_bcast_parts(ref_mpi, &part_complete, part_ncell, max_ncell,
                             node_per, local_xyz, &ncell, &xyz),
        "bcast part");

    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "form-scatter");

    RSS(ref_search_create(&ref_search, ncell), "make search");
    ref_malloc(permutation, ncell, REF_INT);
    RSS(ref_sort_shuffle(ncell, permutation), "shuffle");
    for (i = 0; i < ncell; i++) {
      cell = permutation[i];
      RSS(ref_node_bounding_sphere_xyz(&(xyz[3 * node_per * cell]), node_per,
                                       center, &radius),
          "bound");
      RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
    }
    ref_free(permutation);
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "create-insert");
    if (timing && ref_mpi_once(ref_mpi)) {
      REF_INT depth;
      RSS(ref_search_depth(ref_search, &depth), "depth");
      printf("ncell %d depth %d\n", ncell, depth);
    }
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "depth");

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_search_nearest_element(
              ref_search, node_per, xyz,
              ref_node_xyz_ptr(ref_grid_node(ref_grid), node),
              &(distance[node])),
          "candidates");
    }
    RSS(ref_search_free(ref_search), "free");

    ref_free(xyz);
    if (timing) ref_mpi_stopwatch_stop(ref_mpi, "min(dist)");
  }

  ref_free(part_ncell);
  ref_free(local_xyz);
  return REF_SUCCESS;
}